

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<Data::Parameter> __l;
  Parameter *local_330;
  undefined1 local_238 [8];
  Sample_t<kiste::terminal_t,_Data,_kiste::html> sample;
  html serializer;
  ostream *os;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  allocator<char> local_205;
  allocator<char> local_204;
  allocator<char> local_203;
  undefined1 local_202;
  undefined1 local_201;
  allocator<char> local_200;
  allocator<char> local_1ff;
  allocator<char> local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  Parameter *local_1f8;
  Parameter local_1f0;
  string local_190 [32];
  string asStack_170 [32];
  string asStack_150 [32];
  string local_130 [32];
  string asStack_110 [32];
  string asStack_f0 [32];
  iterator local_d0;
  size_type local_c8;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd [20];
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  Data data;
  
  data.params.super__Vector_base<Data::Parameter,_std::allocator<Data::Parameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"Less <, Greater >, And &, Quot \", Tick \'",&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(data.documentTitle.field_2._M_local_buf + 8),"#ddd",local_bd);
  std::allocator<char>::~allocator(local_bd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(data.backgroundColor.field_2._M_local_buf + 8),
             "https://www.test.com/?kiste=easy&cheesecake=yammi",&local_be);
  std::allocator<char>::~allocator(&local_be);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(data.formUrl.field_2._M_local_buf + 8),"somewhere",&local_bf);
  std::allocator<char>::~allocator(&local_bf);
  local_208 = 1;
  local_1f8 = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"HIDDEN",&local_1f9);
  local_1fd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0.name,"SECRET",&local_1fa);
  local_1fc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0.value,"Shhhh!",&local_1fb)
  ;
  local_1fc = 0;
  local_1fd = 0;
  local_1f8 = (Parameter *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"TEXT",&local_1fe);
  local_202 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_170,"name",&local_1ff);
  local_201 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_150,"",&local_200);
  local_201 = 0;
  local_202 = 0;
  local_1f8 = (Parameter *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"SUBMIT",&local_203);
  local_207 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_110,"submit",&local_204);
  local_206 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_f0,"Submit",&local_205);
  local_206 = 0;
  local_207 = 0;
  local_208 = 0;
  local_d0 = &local_1f0;
  local_c8 = 3;
  std::allocator<Data::Parameter>::allocator((allocator<Data::Parameter> *)((long)&os + 7));
  __l._M_len = local_c8;
  __l._M_array = local_d0;
  std::vector<Data::Parameter,_std::allocator<Data::Parameter>_>::vector
            ((vector<Data::Parameter,_std::allocator<Data::Parameter>_> *)
             ((long)&data.formTarget.field_2 + 8),__l,(allocator<Data::Parameter> *)((long)&os + 7))
  ;
  std::allocator<Data::Parameter>::~allocator((allocator<Data::Parameter> *)((long)&os + 7));
  local_330 = (Parameter *)&local_d0;
  do {
    local_330 = local_330 + -1;
    Data::Parameter::~Parameter(local_330);
  } while (local_330 != &local_1f0);
  std::allocator<char>::~allocator(&local_205);
  std::allocator<char>::~allocator(&local_204);
  std::allocator<char>::~allocator(&local_203);
  std::allocator<char>::~allocator(&local_200);
  std::allocator<char>::~allocator(&local_1ff);
  std::allocator<char>::~allocator(&local_1fe);
  std::allocator<char>::~allocator(&local_1fb);
  std::allocator<char>::~allocator(&local_1fa);
  std::allocator<char>::~allocator(&local_1f9);
  kiste::html::html((html *)&sample._serialize,(ostream *)&std::cout);
  test::Sample_generator::operator()
            ((Sample_t<kiste::terminal_t,_Data,_kiste::html> *)local_238,
             (Sample_generator *)&test::Sample,(Data *)local_a8,(html *)&sample._serialize);
  test::Sample_t<kiste::terminal_t,_Data,_kiste::html>::render
            ((Sample_t<kiste::terminal_t,_Data,_kiste::html> *)local_238);
  Data::~Data((Data *)local_a8);
  return data.params.super__Vector_base<Data::Parameter,_std::allocator<Data::Parameter>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = kiste::html{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
}